

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ConditionalExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ConditionalExpression,slang::ast::Type_const&,nonstd::span_lite::span<slang::ast::ConditionalExpression::Condition,18446744073709551615ul>,slang::ast::Expression&,slang::ast::Expression&,slang::SourceRange>
          (BumpAllocator *this,Type *args,
          span<slang::ast::ConditionalExpression::Condition,_18446744073709551615UL> *args_1,
          Expression *args_2,Expression *args_3,SourceRange *args_4)

{
  pointer pCVar1;
  size_type sVar2;
  SourceLocation SVar3;
  SourceLocation SVar4;
  ConditionalExpression *pCVar5;
  
  pCVar5 = (ConditionalExpression *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ConditionalExpression *)this->endPtr < pCVar5 + 1) {
    pCVar5 = (ConditionalExpression *)allocateSlow(this,0x50,8);
  }
  else {
    this->head->current = (byte *)(pCVar5 + 1);
  }
  pCVar1 = args_1->data_;
  sVar2 = args_1->size_;
  SVar3 = args_4->startLoc;
  SVar4 = args_4->endLoc;
  (pCVar5->super_Expression).kind = ConditionalOp;
  (pCVar5->super_Expression).type.ptr = args;
  (pCVar5->super_Expression).constant = (ConstantValue *)0x0;
  (pCVar5->super_Expression).syntax = (ExpressionSyntax *)0x0;
  (pCVar5->super_Expression).sourceRange.startLoc = SVar3;
  (pCVar5->super_Expression).sourceRange.endLoc = SVar4;
  (pCVar5->conditions).data_ = pCVar1;
  (pCVar5->conditions).size_ = sVar2;
  pCVar5->left_ = args_2;
  pCVar5->right_ = args_3;
  return pCVar5;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }